

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int __thiscall
ON_TextureMapping::EvaluateSphereMapping
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T)

{
  int iVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  double dVar6;
  ON_3dPoint rst;
  double t0;
  double local_90;
  double local_88;
  double local_80;
  double t1;
  ON_3dVector n;
  ON_3dVector local_58;
  ON_3dPoint local_40;
  
  ON_Xform::operator*(&rst,&this->m_Pxyz,P);
  local_80 = ON_3dVector::Length((ON_3dVector *)&rst);
  if (this->m_projection == ray_projection) {
    ON_Xform::operator*(&n,&this->m_Nxyz,N);
    dVar6 = n.z * rst.z + n.x * rst.x + n.y * rst.y;
    iVar1 = ON_SolveQuadraticEquation
                      (n.z * n.z + n.x * n.x + n.y * n.y,dVar6 + dVar6,
                       rst.z * rst.z + rst.x * rst.x + rst.y * rst.y + -1.0,&t0,&t1);
    if (-1 < iVar1) {
      uVar3 = SUB84(t0,0);
      uVar4 = (undefined4)((ulong)t0 >> 0x20);
      if ((iVar1 != 2) && ((t0 < 0.0 && t0 < t1 || (0.0 <= t1 && t1 < t0)))) {
        t0 = t1;
        uVar3 = SUB84(t1,0);
        uVar4 = (undefined4)((ulong)t1 >> 0x20);
      }
      ::operator*(&local_58,(double)CONCAT44(uVar4,uVar3),&n);
      ON_3dPoint::operator+(&local_40,&rst,&local_58);
      rst.z = local_40.z;
      rst.x = local_40.x;
      rst.y = local_40.y;
    }
  }
  dVar6 = 0.0;
  if ((((rst.y != 0.0) || (NAN(rst.y))) || (rst.x != 0.0)) || (NAN(rst.x))) {
    dVar6 = atan2(rst.y,rst.x);
    dVar6 = dVar6 * 0.5;
  }
  uVar3 = 0;
  uVar4 = 0;
  if ((rst.z != 0.0) || (NAN(rst.z))) {
    local_90 = rst.z;
    local_88 = dVar6;
    dVar6 = ON_2dVector::Length((ON_2dVector *)&rst);
    dVar6 = atan2(local_90,dVar6);
    uVar3 = SUB84(dVar6,0);
    uVar4 = (undefined4)((ulong)dVar6 >> 0x20);
    dVar6 = local_88;
  }
  rst.x = dVar6 / 3.141592653589793;
  uVar2 = -(ulong)(3.141592653589793 < (double)CONCAT44(uVar4,uVar3));
  if (-2.220446049250313e-16 <= rst.x) {
    if (0.0 <= rst.x) {
      if (1.0 < rst.x) {
        rst.x = 1.0;
      }
    }
    else {
      rst.x = 0.0;
    }
  }
  else {
    rst.x = rst.x + 1.0;
  }
  rst.y = (double)(~uVar2 & CONCAT44(uVar4,uVar3) |
                  (ulong)((double)CONCAT44(uVar4,uVar3) + -6.283185307179586) & uVar2) /
          3.141592653589793 + 0.5;
  uVar5 = 0;
  if ((rst.y <= 0.0) || (uVar5 = 0x3ff00000, 1.0 < rst.y)) {
    rst.y = (double)((ulong)uVar5 << 0x20);
  }
  rst.z = local_80;
  ON_Xform::operator*((ON_3dPoint *)&n,&this->m_uvw,&rst);
  T->z = n.z;
  T->x = n.x;
  T->y = n.y;
  return 1;
}

Assistant:

int ON_TextureMapping::EvaluateSphereMapping(
											  const ON_3dPoint& P,
											  const ON_3dVector& N,
											  ON_3dPoint* T
											  ) const
{
  // The matrix m_Pxyz transforms the world coordinate
  // "mapping sphere" into the sphere centered at
  // rst = (0,0,0) with radius 1.0.

  ON_3dPoint rst(m_Pxyz*P);
	const double r = ((const ON_3dVector*)(&rst.x))->Length();
	double t0, t1;

	if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
	{
		ON_3dVector n(m_Nxyz*N);
		// Shoot a ray from P in the direction N and see if it
		// hits the sphere.
		int rc = ON_SolveQuadraticEquation( (n.x*n.x+n.y*n.y+n.z*n.z),
			2.0*(rst.x*n.x+rst.y*n.y+rst.z*n.z),
			(rst.x*rst.x+rst.y*rst.y+rst.z*rst.z) - 1.0,
			&t0, &t1 );
		if (rc >= 0 )
		{
			if ( 2 != rc && 1 == BestHitHelper(t0,t1) )
			{
				t0 = t1;
			}
			rst = rst + t0*n;
		}
	}

	// convert sphere 3d location to longitude, latitude, radius
	double longitude = (0.0 != rst.y || 0.0 != rst.x)
		? atan2(rst.y,rst.x)
		: 0.0;
	double latitude = (0.0 != rst.z)
		? atan2(rst.z,((const ON_2dVector*)(&rst.x))->Length())
		: 0.0;
	if ( latitude > ON_PI )
		latitude -= 2.0*ON_PI;

  // convert longitude to normalized texture coordinate
	rst.x = 0.5*longitude/ON_PI;
	if ( rst.x < -ON_EPSILON )
		rst.x += 1.0;
	else if (rst.x < 0.0)
		rst.x = 0.0;
	else if (rst.x > 1.0)
		rst.x = 1.0;

  // convert longitude to normalized texture coordinate
	rst.y = latitude/ON_PI + 0.5;
  if ( rst.y <= 0.0 )
    rst.y = 0.0;
	else if ( rst.y > 1.0 )
		  rst.y = 1.0;

  // radius is already normalized
	rst.z = r;

  // apply texture coordinate transformation
	*T = m_uvw*rst;

  return 1;
}